

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

unique_ptr<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>_>
 __thiscall spvtools::opt::analysis::IntConstant::CopyIntConstant(IntConstant *this)

{
  long in_RSI;
  Integer *local_18;
  
  local_18 = (Integer *)(**(code **)(**(long **)(in_RSI + 8) + 0x50))();
  MakeUnique<spvtools::opt::analysis::IntConstant,spvtools::opt::analysis::Integer_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
            ((spvtools *)this,&local_18,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x10));
  return (__uniq_ptr_data<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<IntConstant> CopyIntConstant() const {
    return MakeUnique<IntConstant>(type_->AsInteger(), words_);
  }